

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O2

void __thiscall Propagator::propagate(Propagator *this,Wave *wave)

{
  pointer *pptVar1;
  int *piVar2;
  pointer ptVar3;
  pointer paVar4;
  uint *puVar5;
  long lVar6;
  uint *puVar7;
  long lVar8;
  uint uVar9;
  uint x;
  uint y;
  uint y1;
  uint pattern;
  uint x1;
  int local_74;
  Wave *local_70;
  uint local_64;
  uint local_60;
  int local_5c;
  long local_58;
  long local_50;
  uint *local_48;
  int *local_40;
  int *local_38;
  
  local_70 = wave;
  do {
    ptVar3 = (this->propagating).
             super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ptVar3 == (this->propagating).
                  super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      return;
    }
    local_48 = &local_60;
    local_40 = &local_5c;
    local_38 = &local_74;
    std::tuple<unsigned_int&,unsigned_int&,unsigned_int&>::operator=
              ((tuple<unsigned_int&,unsigned_int&,unsigned_int&> *)&local_48,ptVar3 + -1);
    pptVar1 = &(this->propagating).
               super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pptVar1 = *pptVar1 + -1;
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      x = local_5c + directions_x[lVar8];
      if (this->periodic_output == true) {
        uVar9 = local_70->width;
        x = (x + uVar9) % uVar9;
        y = (directions_y[lVar8] + local_74 + local_70->height) % local_70->height;
LAB_001053f9:
        local_64 = uVar9 * y + x;
        paVar4 = (this->propagator_state).
                 super__Vector_base<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar5 = *(pointer *)
                  ((long)&paVar4[local_60]._M_elems[lVar8].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                  8);
        lVar6 = (long)(int)y;
        local_58 = lVar6;
        local_50 = lVar8;
        for (puVar7 = *(uint **)&paVar4[local_60]._M_elems[lVar8].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl; puVar7 < puVar5; puVar7 = puVar7 + 1) {
          piVar2 = (this->compatible).data.
                   super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_start
                   [((this->compatible).width * lVar6 + (long)(int)x) * (this->compatible).depth +
                    (ulong)*puVar7]._M_elems + lVar8;
          *piVar2 = *piVar2 + -1;
          if (*piVar2 == 0) {
            add_to_propagator(this,y,x,*puVar7);
            Wave::set(local_70,local_64,*puVar7,false);
            lVar6 = local_58;
            lVar8 = local_50;
          }
        }
      }
      else {
        uVar9 = local_70->width;
        if ((((int)x < (int)uVar9 && -1 < (int)x) &&
            (y = directions_y[lVar8] + local_74, -1 < (int)y)) && ((int)y < (int)local_70->height))
        goto LAB_001053f9;
      }
    }
  } while( true );
}

Assistant:

void Propagator::propagate(Wave &wave) noexcept {

  // We propagate every element while there is element to propagate.
  while (propagating.size() != 0) {

    // The cell and pattern that has been set to false.
    unsigned y1, x1, pattern;
    std::tie(y1, x1, pattern) = propagating.back();
    propagating.pop_back();

    // We propagate the information in all 4 directions.
    for (unsigned direction = 0; direction < 4; direction++) {

      // We get the next cell in the direction direction.
      int dx = directions_x[direction];
      int dy = directions_y[direction];
      int x2, y2;
      if (periodic_output) {
        x2 = ((int)x1 + dx + (int)wave.width) % wave.width;
        y2 = ((int)y1 + dy + (int)wave.height) % wave.height;
      } else {
        x2 = x1 + dx;
        y2 = y1 + dy;
        if (x2 < 0 || x2 >= (int)wave.width) {
          continue;
        }
        if (y2 < 0 || y2 >= (int)wave.height) {
          continue;
        }
      }

      // The index of the second cell, and the patterns compatible
      unsigned i2 = x2 + y2 * wave.width;
      const std::vector<unsigned> &patterns =
        propagator_state[pattern][direction];

      // For every pattern that could be placed in that cell without being in
      // contradiction with pattern1
      for (auto it = patterns.begin(), it_end = patterns.end(); it < it_end;
           ++it) {

        // We decrease the number of compatible patterns in the opposite
        // direction If the pattern was discarded from the wave, the element
        // is still negative, which is not a problem
        std::array<int, 4> &value = compatible.get(y2, x2, *it);
        value[direction]--;

        // If the element was set to 0 with this operation, we need to remove
        // the pattern from the wave, and propagate the information
        if (value[direction] == 0) {
          add_to_propagator(y2, x2, *it);
          wave.set(i2, *it, false);
        }
      }
    }
  }
}